

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_locale.cpp
# Opt level: O2

ON_Locale *
ON_Locale::FromSubtags
          (ON_Locale *__return_storage_ptr__,char *language_code,char *script,
          char *region_identifier)

{
  char *locale_name;
  char Script [6];
  ON_String language_name;
  
  if ((language_code == (char *)0x0) || (*language_code == '\0')) {
    memcpy(__return_storage_ptr__,&InvariantCulture,0xa0);
  }
  else {
    ON_String::ON_String(&language_name,language_code);
    ON_String::MakeLowerOrdinal(&language_name);
    if ((script != (char *)0x0) &&
       ((*script != '\0' ||
        ((((script[1] != '\0' && (script[2] != '\0')) && (script[3] != '\0')) && (script[4] == '\0')
         ))))) {
      Script[0] = '-';
      Script[1] = ON_String::MapCharacterOrdinal(UpperOrdinal,*script);
      Script[2] = ON_String::MapCharacterOrdinal(LowerOrdinal,*script);
      Script[3] = ON_String::MapCharacterOrdinal(LowerOrdinal,*script);
      Script[4] = ON_String::MapCharacterOrdinal(LowerOrdinal,*script);
      Script[5] = '\0';
      ON_String::operator+=(&language_name,Script);
    }
    if ((region_identifier != (char *)0x0) && (*region_identifier != '\0')) {
      ON_String::ON_String((ON_String *)Script,'-',1);
      ON_String::operator+=((ON_String *)Script,region_identifier);
      ON_String::MakeUpperOrdinal((ON_String *)Script);
      ON_String::operator+=(&language_name,(ON_String *)Script);
      ON_String::~ON_String((ON_String *)Script);
    }
    locale_name = ON_String::operator_cast_to_char_(&language_name);
    FromWindowsName(__return_storage_ptr__,locale_name);
    ON_String::~ON_String(&language_name);
  }
  return __return_storage_ptr__;
}

Assistant:

ON_Locale ON_Locale::FromSubtags(
  const char* language_code,
  const char* script,
  const char* region_identifier
  )
{
  if (nullptr == language_code || 0 == language_code[0])
    return ON_Locale::InvariantCulture;

  ON_String language_name(language_code);
  language_name.MakeLowerOrdinal();

  if ( nullptr != script && (0 != script[0] || (0 != script[1] && 0 != script[2] && 0 != script[3] && 0 == script[4])) )
  {
    char Script[6];
    Script[0] = '-';
    Script[1] = ON_String::MapCharacterOrdinal(ON_StringMapOrdinalType::UpperOrdinal,script[0]);
    Script[2] = ON_String::MapCharacterOrdinal(ON_StringMapOrdinalType::LowerOrdinal,script[0]);
    Script[3] = ON_String::MapCharacterOrdinal(ON_StringMapOrdinalType::LowerOrdinal,script[0]);
    Script[4] = ON_String::MapCharacterOrdinal(ON_StringMapOrdinalType::LowerOrdinal,script[0]);
    Script[5] = 0;
    language_name += Script;
  }

  if (nullptr != region_identifier && 0 != region_identifier[0])
  {
    ON_String REGION = '-';
    REGION += region_identifier;
    REGION.MakeUpperOrdinal();
    language_name += REGION;
  }

  return ON_Locale::FromBCP47LanguageName(language_name);
}